

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void c2mir_init(MIR_context_t ctx)

{
  c2m_ctx_t *ppcVar1;
  c2m_ctx_t c2m_ctx_00;
  c2m_ctx *c2m_ctx;
  c2m_ctx **c2m_ctx_ptr;
  MIR_context_t ctx_local;
  
  ppcVar1 = c2m_ctx_loc(ctx);
  c2m_ctx_00 = (c2m_ctx_t)c2mir_calloc((c2m_ctx_t)0x0,0x208);
  *ppcVar1 = c2m_ctx_00;
  c2m_ctx_00->ctx = ctx;
  reg_memory_init(c2m_ctx_00);
  str_init(c2m_ctx_00);
  return;
}

Assistant:

void c2mir_init (MIR_context_t ctx) {
  struct c2m_ctx **c2m_ctx_ptr = c2m_ctx_loc (ctx), *c2m_ctx;

  *c2m_ctx_ptr = c2m_ctx = c2mir_calloc (NULL, sizeof (struct c2m_ctx));
  c2m_ctx->ctx = ctx;
  reg_memory_init (c2m_ctx);
  str_init (c2m_ctx);
}